

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O2

VRDisplayNode *
MinVR::VRStereoNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  bool bVar1;
  int iVar2;
  VRAnyCoreType VVar3;
  undefined4 extraout_var;
  VRStereoNode *this;
  VRStereoFormat format;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  allocator<char> local_105;
  float local_104;
  string local_100;
  string formatStr;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"GraphicsToolkit",&local_105);
  std::__cxx11::string::string((string *)&local_40,(string *)nameSpace);
  VVar3 = VRDataIndex::getValue(config,&local_100,&local_40,true);
  (*(VVar3.datum)->_vptr_VRDatum[2])(&formatStr,VVar3.datum);
  iVar2 = (*vrMain->_vptr_VRMainInterface[5])(vrMain,&formatStr);
  std::__cxx11::string::~string((string *)&formatStr);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"StereoFormat",&local_105)
  ;
  std::__cxx11::string::string((string *)&local_60,(string *)nameSpace);
  VVar3 = VRDataIndex::getValue(config,&local_100,&local_60,true);
  (*(VVar3.datum)->_vptr_VRDatum[2])(&formatStr,VVar3.datum);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = std::operator==(&formatStr,"QuadBuffered");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"EyeSeparation",&local_105);
    std::__cxx11::string::string((string *)&local_80,(string *)nameSpace);
    format = VRSTEREOFORMAT_QUADBUFFERED;
    VVar3 = VRDataIndex::getValue(config,&local_100,&local_80,true);
    (*(VVar3.datum)->_vptr_VRDatum[8])(VVar3.datum);
    local_104 = extraout_XMM0_Da;
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    bVar1 = std::operator==(&formatStr,"SideBySide");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"EyeSeparation",&local_105);
      std::__cxx11::string::string((string *)&local_a0,(string *)nameSpace);
      VVar3 = VRDataIndex::getValue(config,&local_100,&local_a0,true);
      (*(VVar3.datum)->_vptr_VRDatum[8])(VVar3.datum);
      local_104 = extraout_XMM0_Da_00;
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_100);
      format = VRSTEREOFORMAT_SIDEBYSIDE;
    }
    else {
      bVar1 = std::operator==(&formatStr,"ColumnInterlaced");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"EyeSeparation",&local_105);
        std::__cxx11::string::string((string *)&local_c0,(string *)nameSpace);
        VVar3 = VRDataIndex::getValue(config,&local_100,&local_c0,true);
        (*(VVar3.datum)->_vptr_VRDatum[8])(VVar3.datum);
        local_104 = extraout_XMM0_Da_01;
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_100);
        format = VRSTEREOFORMAT_COLUMNINTERLACED;
      }
      else {
        format = VRSTEREOFORMAT_MONO;
        local_104 = 0.0;
      }
    }
  }
  this = (VRStereoNode *)operator_new(0x80);
  VRStereoNode(this,nameSpace,local_104,(VRGraphicsToolkit *)CONCAT44(extraout_var,iVar2),format);
  std::__cxx11::string::~string((string *)&formatStr);
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRStereoNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace)
{

	VRGraphicsToolkit *gfxToolkit = vrMain->getGraphicsToolkit(config->getValue("GraphicsToolkit", nameSpace));
	float iod = 0.0f;
	std::string formatStr = config->getValue("StereoFormat", nameSpace);
	VRStereoNode::VRStereoFormat format = VRStereoNode::VRSTEREOFORMAT_MONO;
	if (formatStr == "QuadBuffered") {
		format = VRStereoNode::VRSTEREOFORMAT_QUADBUFFERED;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}
	else if (formatStr == "SideBySide") {
		format = VRStereoNode::VRSTEREOFORMAT_SIDEBYSIDE;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}
	else if (formatStr == "ColumnInterlaced") {
		format = VRStereoNode::VRSTEREOFORMAT_COLUMNINTERLACED;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}

	VRDisplayNode *node = new VRStereoNode(nameSpace, iod, gfxToolkit, format);

	return node;
}